

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

int arkStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  ARKodeARKStepMem step_mem;
  sunrealtype *psVar1;
  int iVar2;
  N_Vector *pp_Var3;
  int error_code;
  N_Vector p_Var4;
  char *msgfmt;
  int iVar5;
  bool bVar6;
  int nvec;
  sunrealtype stage_coefs;
  int local_54;
  sunrealtype *local_50;
  N_Vector *local_48;
  sunrealtype local_40;
  sunrealtype local_38;
  
  local_40 = 1.0;
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;
  local_38 = t;
  if (step_mem == (ARKodeARKStepMem)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar5 = -0x15;
    error_code = -0x15;
    iVar2 = 0x864;
LAB_0011e65d:
    arkProcessError(ark_mem,error_code,iVar2,"arkStep_FullRHS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,msgfmt);
  }
  else {
    local_50 = step_mem->cvals;
    local_48 = step_mem->Xvecs;
    if (((step_mem->mass_type == 2) && (step_mem->msetup != (ARKMassSetupFn)0x0)) &&
       (iVar2 = (*step_mem->msetup)(ark_mem,t,f,ark_mem->tempv2,ark_mem->tempv3), iVar2 != 0)) {
      return -0xf;
    }
    if (mode == 2) {
      if (step_mem->explicit != 0) {
        iVar2 = (*step_mem->fe)(t,y,ark_mem->tempv2,ark_mem->user_data);
        step_mem->nfe = step_mem->nfe + 1;
        if (iVar2 != 0) {
          iVar2 = 0x61e;
          goto LAB_0011e8b7;
        }
      }
      if (step_mem->implicit != 0) {
        iVar2 = (*step_mem->fi)(t,y,step_mem->sdata,ark_mem->user_data);
        step_mem->nfi = step_mem->nfi + 1;
        if (iVar2 != 0) {
          iVar2 = 0x62b;
          goto LAB_0011e8b7;
        }
      }
      if (step_mem->explicit == 0) {
        if (step_mem->implicit == 0) goto LAB_0011e5f2;
        p_Var4 = step_mem->sdata;
LAB_0011e5f9:
        N_VScale(0x3ff0000000000000,p_Var4,f);
      }
      else {
        if (step_mem->implicit == 0) {
LAB_0011e5f2:
          p_Var4 = ark_mem->tempv2;
          goto LAB_0011e5f9;
        }
        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,step_mem->sdata,ark_mem->tempv2,f);
      }
      if ((step_mem->mass_type != 0) &&
         (iVar2 = (*step_mem->msolve)(ark_mem,f,step_mem->nlscoef / ark_mem->h), iVar2 != 0)) {
        msgfmt = "Mass matrix solver failure";
        iVar5 = -0x10;
        error_code = -0x10;
        iVar2 = 0x646;
        goto LAB_0011e65d;
      }
    }
    else if (mode == 1) {
      if (ark_mem->fn_is_current == 0) {
        if (step_mem->explicit == 0) {
          bVar6 = false;
        }
        else {
          iVar2 = ARKodeButcherTable_IsStifflyAccurate(step_mem->Be);
          bVar6 = iVar2 == 0;
        }
        if ((step_mem->implicit != 0) &&
           (iVar2 = ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi), iVar2 == 0)) {
          bVar6 = true;
        }
        if (bVar6 || ark_mem->relax_enabled != 0) {
          if (step_mem->explicit != 0) {
            iVar2 = (*step_mem->fe)(t,y,*step_mem->Fe,ark_mem->user_data);
            step_mem->nfe = step_mem->nfe + 1;
            if (iVar2 != 0) {
              iVar2 = 0x5b1;
              goto LAB_0011e8b7;
            }
            if ((step_mem->mass_type == 2) &&
               (iVar2 = (*step_mem->msolve)(ark_mem,*step_mem->Fe,step_mem->nlscoef / ark_mem->h),
               iVar2 != 0)) {
              msgfmt = "Mass matrix solver failure";
              iVar5 = -0x10;
              error_code = -0x10;
              iVar2 = 0x5bd;
              goto LAB_0011e65d;
            }
          }
          if (step_mem->implicit != 0) {
            iVar2 = (*step_mem->fi)(t,y,*step_mem->Fi,ark_mem->user_data);
            step_mem->nfi = step_mem->nfi + 1;
            if (iVar2 != 0) {
              iVar2 = 0x5cb;
              goto LAB_0011e8b7;
            }
            if ((step_mem->mass_type == 2) &&
               (iVar2 = (*step_mem->msolve)(ark_mem,*step_mem->Fi,step_mem->nlscoef / ark_mem->h),
               iVar2 != 0)) {
              msgfmt = "Mass matrix solver failure";
              iVar5 = -0x10;
              error_code = -0x10;
              iVar2 = 0x5d7;
              goto LAB_0011e65d;
            }
          }
        }
        else {
          if (step_mem->explicit != 0) {
            N_VScale(0x3ff0000000000000,step_mem->Fe[(long)step_mem->stages + -1],*step_mem->Fe);
          }
          if (step_mem->implicit != 0) {
            N_VScale(0x3ff0000000000000,step_mem->Fi[(long)step_mem->stages + -1],*step_mem->Fi);
          }
        }
      }
      if (step_mem->explicit == 0) {
        if (step_mem->implicit == 0) goto LAB_0011e419;
        pp_Var3 = step_mem->Fi;
LAB_0011e41d:
        N_VScale(0x3ff0000000000000,*pp_Var3,f);
      }
      else {
        if (step_mem->implicit == 0) {
LAB_0011e419:
          pp_Var3 = step_mem->Fe;
          goto LAB_0011e41d;
        }
        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,*step_mem->Fi,*step_mem->Fe,f);
      }
      if ((step_mem->mass_type == 1) &&
         (iVar2 = (*step_mem->msolve)(ark_mem,f,step_mem->nlscoef / ark_mem->h), iVar2 != 0)) {
        msgfmt = "Mass matrix solver failure";
        iVar5 = -0x10;
        error_code = -0x10;
        iVar2 = 0x603;
        goto LAB_0011e65d;
      }
    }
    else {
      if (mode != 0) {
        msgfmt = "Unknown full RHS mode";
        iVar5 = -8;
        error_code = -8;
        iVar2 = 0x65a;
        goto LAB_0011e65d;
      }
      if (ark_mem->fn_is_current == 0) {
        if (step_mem->explicit != 0) {
          iVar2 = (*step_mem->fe)(t,y,*step_mem->Fe,ark_mem->user_data);
          step_mem->nfe = step_mem->nfe + 1;
          if (iVar2 != 0) {
            iVar2 = 0x534;
            goto LAB_0011e8b7;
          }
          if ((step_mem->mass_type == 2) &&
             (iVar2 = (*step_mem->msolve)(ark_mem,*step_mem->Fe,step_mem->nlscoef / ark_mem->h),
             iVar2 != 0)) {
            msgfmt = "Mass matrix solver failure";
            iVar5 = -0x10;
            error_code = -0x10;
            iVar2 = 0x540;
            goto LAB_0011e65d;
          }
        }
        if (step_mem->implicit != 0) {
          iVar2 = (*step_mem->fi)(t,y,*step_mem->Fi,ark_mem->user_data);
          step_mem->nfi = step_mem->nfi + 1;
          if (iVar2 != 0) {
            iVar2 = 0x54e;
LAB_0011e8b7:
            arkProcessError(ark_mem,-8,iVar2,"arkStep_FullRHS",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                            ,
                            "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                            ,t);
            return -8;
          }
          if ((step_mem->mass_type == 2) &&
             (iVar2 = (*step_mem->msolve)(ark_mem,*step_mem->Fi,step_mem->nlscoef / ark_mem->h),
             iVar2 != 0)) {
            msgfmt = "Mass matrix solver failure";
            iVar5 = -0x10;
            error_code = -0x10;
            iVar2 = 0x55a;
            goto LAB_0011e65d;
          }
        }
      }
      if (step_mem->explicit == 0) {
        if (step_mem->implicit == 0) goto LAB_0011e49b;
        pp_Var3 = step_mem->Fi;
LAB_0011e49f:
        N_VScale(0x3ff0000000000000,*pp_Var3,f);
      }
      else {
        if (step_mem->implicit == 0) {
LAB_0011e49b:
          pp_Var3 = step_mem->Fe;
          goto LAB_0011e49f;
        }
        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,*step_mem->Fi,*step_mem->Fe,f);
      }
      if ((step_mem->mass_type == 1) &&
         (iVar2 = (*step_mem->msolve)(ark_mem,f,step_mem->nlscoef / ark_mem->h), iVar2 != 0)) {
        msgfmt = "Mass matrix solver failure";
        iVar5 = -0x10;
        error_code = -0x10;
        iVar2 = 0x57a;
        goto LAB_0011e65d;
      }
    }
    pp_Var3 = local_48;
    psVar1 = local_50;
    if ((step_mem->expforcing != 0) || (step_mem->impforcing != 0)) {
      *local_50 = 1.0;
      *local_48 = f;
      local_54 = 1;
      arkStep_ApplyForcing(step_mem,&local_38,&local_40,1,&local_54);
      N_VLinearCombination(local_54,psVar1,pp_Var3,f);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int arkStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y, N_Vector f,
                    int mode)
{
  ARKodeARKStepMem step_mem;
  int nvec, retval;
  sunbooleantype recomputeRHS;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  sunrealtype stage_coefs = ONE;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* local shortcuts for use with fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* setup mass-matrix if required (use output f as a temporary) */
  if ((step_mem->mass_type == MASS_TIMEDEP) && (step_mem->msetup != NULL))
  {
    retval = step_mem->msetup((void*)ark_mem, t, f, ark_mem->tempv2,
                              ark_mem->tempv3);
    if (retval != ARK_SUCCESS) { return (ARK_MASSSETUP_FAIL); }
  }

  /* perform RHS functions contingent on 'mode' argument */
  switch (mode)
  {
  case ARK_FULLRHS_START:

    /* compute the full RHS */
    if (!(ark_mem->fn_is_current))
    {
      /* compute the explicit component */
      if (step_mem->explicit)
      {
        retval = step_mem->fe(t, y, step_mem->Fe[0], ark_mem->user_data);
        step_mem->nfe++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }

        /* compute and store M(t)^{-1} fe */
        if (step_mem->mass_type == MASS_TIMEDEP)
        {
          retval = step_mem->msolve((void*)ark_mem, step_mem->Fe[0],
                                    step_mem->nlscoef / ark_mem->h);
          if (retval)
          {
            arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                            __FILE__, "Mass matrix solver failure");
            return ARK_MASSSOLVE_FAIL;
          }
        }
      }

      /* compute the implicit component */
      if (step_mem->implicit)
      {
        retval = step_mem->fi(t, y, step_mem->Fi[0], ark_mem->user_data);
        step_mem->nfi++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }

        /* compute and store M(t)^{-1} fi */
        if (step_mem->mass_type == MASS_TIMEDEP)
        {
          retval = step_mem->msolve((void*)ark_mem, step_mem->Fi[0],
                                    step_mem->nlscoef / ark_mem->h);
          if (retval)
          {
            arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                            __FILE__, "Mass matrix solver failure");
            return ARK_MASSSOLVE_FAIL;
          }
        }
      }
    }

    /* combine RHS vector(s) into output */
    if (step_mem->explicit && step_mem->implicit)
    {
      /* ImEx */
      N_VLinearSum(ONE, step_mem->Fi[0], ONE, step_mem->Fe[0], f);
    }
    else if (step_mem->implicit)
    {
      /* implicit */
      N_VScale(ONE, step_mem->Fi[0], f);
    }
    else
    {
      /* explicit */
      N_VScale(ONE, step_mem->Fe[0], f);
    }

    /* compute M^{-1} f for output but do not store */
    if (step_mem->mass_type == MASS_FIXED)
    {
      retval = step_mem->msolve((void*)ark_mem, f,
                                step_mem->nlscoef / ark_mem->h);
      if (retval)
      {
        arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                        __FILE__, "Mass matrix solver failure");
        return ARK_MASSSOLVE_FAIL;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      cvals[0] = ONE;
      Xvecs[0] = f;
      nvec     = 1;
      arkStep_ApplyForcing(step_mem, &t, &stage_coefs, 1, &nvec);
      N_VLinearCombination(nvec, cvals, Xvecs, f);
    }

    break;

  case ARK_FULLRHS_END:

    /* compute the full RHS */
    if (!(ark_mem->fn_is_current))
    {
      /* determine if RHS functions need to be recomputed */
      recomputeRHS = SUNFALSE;

      if (step_mem->explicit)
      {
        if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Be))
        {
          recomputeRHS = SUNTRUE;
        }
      }

      if (step_mem->implicit)
      {
        if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi))
        {
          recomputeRHS = SUNTRUE;
        }
      }

      /* Stiffly Accurate methods are not SA when relaxation is enabled */
      if (ark_mem->relax_enabled) { recomputeRHS = SUNTRUE; }

      /* recompute RHS functions */
      if (recomputeRHS)
      {
        /* compute the explicit component */
        if (step_mem->explicit)
        {
          retval = step_mem->fe(t, y, step_mem->Fe[0], ark_mem->user_data);
          step_mem->nfe++;
          if (retval != 0)
          {
            arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                            __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
            return (ARK_RHSFUNC_FAIL);
          }

          /* compute and store M(t)^{-1} fi */
          if (step_mem->mass_type == MASS_TIMEDEP)
          {
            retval = step_mem->msolve((void*)ark_mem, step_mem->Fe[0],
                                      step_mem->nlscoef / ark_mem->h);
            if (retval)
            {
              arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                              __FILE__, "Mass matrix solver failure");
              return ARK_MASSSOLVE_FAIL;
            }
          }
        }

        /* compute the implicit component */
        if (step_mem->implicit)
        {
          retval = step_mem->fi(t, y, step_mem->Fi[0], ark_mem->user_data);
          step_mem->nfi++;
          if (retval != 0)
          {
            arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                            __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
            return (ARK_RHSFUNC_FAIL);
          }

          /* compute and store M(t)^{-1} fi */
          if (step_mem->mass_type == MASS_TIMEDEP)
          {
            retval = step_mem->msolve((void*)ark_mem, step_mem->Fi[0],
                                      step_mem->nlscoef / ark_mem->h);
            if (retval)
            {
              arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                              __FILE__, "Mass matrix solver failure");
              return ARK_MASSSOLVE_FAIL;
            }
          }
        }
      }
      else
      {
        if (step_mem->explicit)
        {
          N_VScale(ONE, step_mem->Fe[step_mem->stages - 1], step_mem->Fe[0]);
        }
        if (step_mem->implicit)
        {
          N_VScale(ONE, step_mem->Fi[step_mem->stages - 1], step_mem->Fi[0]);
        }
      }
    }

    /* combine RHS vector(s) into output */
    if (step_mem->explicit && step_mem->implicit)
    {
      /* ImEx */
      N_VLinearSum(ONE, step_mem->Fi[0], ONE, step_mem->Fe[0], f);
    }
    else if (step_mem->implicit)
    {
      /* implicit */
      N_VScale(ONE, step_mem->Fi[0], f);
    }
    else
    {
      /* explicit */
      N_VScale(ONE, step_mem->Fe[0], f);
    }

    /* compute M^{-1} f for output but do not store */
    if (step_mem->mass_type == MASS_FIXED)
    {
      retval = step_mem->msolve((void*)ark_mem, f,
                                step_mem->nlscoef / ark_mem->h);
      if (retval)
      {
        arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                        __FILE__, "Mass matrix solver failure");
        return ARK_MASSSOLVE_FAIL;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      cvals[0] = ONE;
      Xvecs[0] = f;
      nvec     = 1;
      arkStep_ApplyForcing(step_mem, &t, &stage_coefs, 1, &nvec);
      N_VLinearCombination(nvec, cvals, Xvecs, f);
    }

    break;

  case ARK_FULLRHS_OTHER:

    /* compute the explicit component and store in ark_tempv2 */
    if (step_mem->explicit)
    {
      retval = step_mem->fe(t, y, ark_mem->tempv2, ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RHSFUNC_FAILED, t);
        return (ARK_RHSFUNC_FAIL);
      }
    }

    /* compute the implicit component and store in sdata */
    if (step_mem->implicit)
    {
      retval = step_mem->fi(t, y, step_mem->sdata, ark_mem->user_data);
      step_mem->nfi++;
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RHSFUNC_FAILED, t);
        return (ARK_RHSFUNC_FAIL);
      }
    }

    /* combine RHS vector(s) into output */
    if (step_mem->explicit && step_mem->implicit)
    { /* ImEx */
      N_VLinearSum(ONE, step_mem->sdata, ONE, ark_mem->tempv2, f);
    }
    else if (step_mem->implicit)
    { /* implicit */
      N_VScale(ONE, step_mem->sdata, f);
    }
    else
    { /* explicit */
      N_VScale(ONE, ark_mem->tempv2, f);
    }

    /* compute M^{-1} f for output but do not store */
    if (step_mem->mass_type != MASS_IDENTITY)
    {
      retval = step_mem->msolve((void*)ark_mem, f,
                                step_mem->nlscoef / ark_mem->h);
      if (retval)
      {
        arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                        __FILE__, "Mass matrix solver failure");
        return ARK_MASSSOLVE_FAIL;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      cvals[0] = ONE;
      Xvecs[0] = f;
      nvec     = 1;
      arkStep_ApplyForcing(step_mem, &t, &stage_coefs, 1, &nvec);
      N_VLinearCombination(nvec, cvals, Xvecs, f);
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    "Unknown full RHS mode");
    return (ARK_RHSFUNC_FAIL);
  }

  return (ARK_SUCCESS);
}